

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_stack.h
# Opt level: O2

void uo_stack_push_arr(uo_stack *stack,void **items,size_t count)

{
  uint64_t n;
  uint64_t uVar1;
  void **__ptr;
  size_t sVar2;
  
  __ptr = stack->items;
  sVar2 = stack->count;
  n = sVar2 + count;
  if (stack->capacity < n) {
    uVar1 = next_power_of_two(n);
    stack->capacity = uVar1;
    __ptr = (void **)realloc(__ptr,uVar1 * 8);
    stack->items = __ptr;
    sVar2 = stack->count;
  }
  memcpy(__ptr + sVar2,items,count << 3);
  stack->count = n;
  return;
}

Assistant:

static inline void uo_stack_push_arr(
    uo_stack *stack,
    void *const *items,
    size_t count)
{
    size_t stack_count = count + stack->count;

    if (stack_count > stack->capacity)
        stack->items = realloc(stack->items, sizeof *stack->items * (stack->capacity = next_power_of_two(stack_count)));

    memcpy(stack->items + stack->count, items, sizeof *items * count);
    stack->count = stack_count;
}